

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O0

void foo6(int *a)

{
  ostream *poVar1;
  saver_success<int_&> local_30;
  int local_14;
  int *piStack_10;
  int NEARGYE_INTERNAL_OBJECT_2;
  int *a_local;
  
  local_14 = 1;
  piStack_10 = a;
  while (local_14 != 0) {
    *piStack_10 = 1;
    local_14 = local_14 + -1;
    poVar1 = std::operator<<((ostream *)&std::cout,"foo6 a = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*piStack_10);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    nstd::saver_success<int_&>::state_saver(&local_30,piStack_10);
    nstd::saver_success<int_&>::~saver_success(&local_30);
  }
  local_14 = local_14 + -1;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo6 a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*piStack_10);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void foo6(int& a) {
  WITH_SAVER_SUCCESS(a) {
    a = 1;
    std::cout << "foo6 a = " << a << std::endl;
    // Original state will automatically restored, on scope leave when no exceptions have been thrown.
  }

  std::cout << "foo6 a = " << a << std::endl;
}